

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool Fossilize::Hashing::compute_hash_render_pass
               (VkRenderPassCreateInfo *create_info,Hash *out_hash)

{
  VkSubpassDescription *pVVar1;
  VkAttachmentDescription *pVVar2;
  VkSubpassDependency *pVVar3;
  VkAttachmentReference *pVVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint32_t i;
  ulong uVar12;
  ulong uVar13;
  Hasher local_38;
  
  uVar7 = (ulong)create_info->attachmentCount;
  uVar6 = ((ulong)create_info->flags ^ 0xaf63bd4c8601b7df) * 0x100000001b3;
  if ((ulong)create_info->flags == 0) {
    uVar6 = 0xaf63bd4c8601b7df;
  }
  uVar8 = (ulong)create_info->subpassCount;
  uVar9 = (ulong)create_info->dependencyCount;
  local_38.h = ((uVar6 ^ uVar7) * 0x100000001b3 ^ uVar9) * 0x100000001b3 ^ uVar8;
  if (uVar7 != 0) {
    pVVar2 = create_info->pAttachments;
    lVar10 = 0;
    do {
      local_38.h = ((((((((local_38.h * 0x100000001b3 ^
                          (ulong)*(uint *)((long)&pVVar2->flags + lVar10)) * 0x100000001b3 ^
                         (ulong)*(uint *)((long)&pVVar2->initialLayout + lVar10)) * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar2->finalLayout + lVar10)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar2->format + lVar10)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&pVVar2->loadOp + lVar10)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar2->storeOp + lVar10)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)&pVVar2->stencilLoadOp + lVar10)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar2->stencilStoreOp + lVar10)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar2->samples + lVar10);
      lVar10 = lVar10 + 0x24;
    } while (uVar7 * 0x24 != lVar10);
  }
  if (uVar9 != 0) {
    pVVar3 = create_info->pDependencies;
    lVar10 = 0;
    do {
      local_38.h = ((((((local_38.h * 0x100000001b3 ^
                        (ulong)*(uint *)((long)&pVVar3->dependencyFlags + lVar10)) * 0x100000001b3 ^
                       (ulong)*(uint *)((long)&pVVar3->dstAccessMask + lVar10)) * 0x100000001b3 ^
                      (ulong)*(uint *)((long)&pVVar3->srcAccessMask + lVar10)) * 0x100000001b3 ^
                     (ulong)*(uint *)((long)&pVVar3->srcSubpass + lVar10)) * 0x100000001b3 ^
                    (ulong)*(uint *)((long)&pVVar3->dstSubpass + lVar10)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar3->srcStageMask + lVar10)) * 0x100000001b3 ^
                   (ulong)*(uint *)((long)&pVVar3->dstStageMask + lVar10);
      lVar10 = lVar10 + 0x1c;
    } while (uVar9 * 0x1c != lVar10);
  }
  if (uVar8 != 0) {
    uVar6 = 0;
    do {
      pVVar1 = create_info->pSubpasses + uVar6;
      uVar9 = (ulong)pVVar1->colorAttachmentCount;
      uVar12 = (ulong)pVVar1->inputAttachmentCount;
      uVar13 = (ulong)pVVar1->preserveAttachmentCount;
      uVar7 = ((((local_38.h * 0x100000001b3 ^ (ulong)pVVar1->flags) * 0x100000001b3 ^ uVar9) *
                0x100000001b3 ^ uVar12) * 0x100000001b3 ^ uVar13) * 0x100000001b3 ^
              (ulong)pVVar1->pipelineBindPoint;
      if (uVar13 != 0) {
        uVar11 = 0;
        do {
          uVar7 = uVar7 * 0x100000001b3 ^ (ulong)pVVar1->pPreserveAttachments[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar13 != uVar11);
      }
      if (uVar9 != 0) {
        uVar13 = 0;
        do {
          uVar7 = (uVar7 * 0x100000001b3 ^ (ulong)pVVar1->pColorAttachments[uVar13].attachment) *
                  0x100000001b3 ^ (ulong)pVVar1->pColorAttachments[uVar13].layout;
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
      if (uVar12 != 0) {
        uVar13 = 0;
        do {
          uVar7 = (uVar7 * 0x100000001b3 ^ (ulong)pVVar1->pInputAttachments[uVar13].attachment) *
                  0x100000001b3 ^ (ulong)pVVar1->pInputAttachments[uVar13].layout;
          uVar13 = uVar13 + 1;
        } while (uVar12 != uVar13);
      }
      pVVar4 = pVVar1->pResolveAttachments;
      if (pVVar1->colorAttachmentCount != 0 && pVVar4 != (VkAttachmentReference *)0x0) {
        uVar12 = 0;
        do {
          uVar7 = (uVar7 * 0x100000001b3 ^ (ulong)pVVar4[uVar12].attachment) * 0x100000001b3 ^
                  (ulong)pVVar4[uVar12].layout;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
      pVVar4 = pVVar1->pDepthStencilAttachment;
      if (pVVar4 == (VkAttachmentReference *)0x0) {
        local_38.h = uVar7 * 0x100000001b3;
      }
      else {
        local_38.h = (uVar7 * 0x100000001b3 ^ (ulong)pVVar4->attachment) * 0x100000001b3 ^
                     (ulong)pVVar4->layout;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar8);
  }
  bVar5 = hash_pnext_chain((StateRecorder *)0x0,&local_38,create_info->pNext,(DynamicStateInfo *)0x0
                           ,0);
  if (bVar5) {
    *out_hash = local_38.h;
  }
  return bVar5;
}

Assistant:

bool compute_hash_render_pass(const VkRenderPassCreateInfo &create_info, Hash *out_hash)
{
	Hasher h;

	// Conditionally branch to remain hash compatible.
	if (create_info.flags != 0)
		h.u32(create_info.flags);

	h.u32(create_info.attachmentCount);
	h.u32(create_info.dependencyCount);
	h.u32(create_info.subpassCount);

	for (uint32_t i = 0; i < create_info.attachmentCount; i++)
	{
		auto &att = create_info.pAttachments[i];
		hash_attachment(h, att);
	}

	for (uint32_t i = 0; i < create_info.dependencyCount; i++)
	{
		auto &dep = create_info.pDependencies[i];
		hash_dependency(h, dep);
	}

	for (uint32_t i = 0; i < create_info.subpassCount; i++)
	{
		auto &subpass = create_info.pSubpasses[i];
		hash_subpass(h, subpass);
	}

	if (!hash_pnext_chain(nullptr, h, create_info.pNext, nullptr, 0))
		return false;

	*out_hash = h.get();
	return true;
}